

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O3

double __thiscall HyperGraph::self_inf_cal(HyperGraph *this,Nodelist *vecSeed)

{
  uint uVar1;
  uint *puVar2;
  pointer pvVar3;
  ulong *puVar4;
  size_t sVar5;
  void *pvVar6;
  const_iterator __begin1;
  uint *puVar7;
  long lVar8;
  uint *puVar9;
  ulong *puVar10;
  int iVar11;
  ulong uVar12;
  Nodelist *__range1;
  ulong uVar13;
  undefined1 auVar14 [16];
  allocator_type local_82;
  allocator_type local_81;
  double local_80;
  vector<bool,_std::allocator<bool>_> local_78;
  vector<bool,_std::allocator<bool>_> local_50;
  
  local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_78,this->__numRRsets,(bool *)&local_50,&local_82);
  local_82 = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_50,(ulong)this->__numV,(bool *)&local_82,&local_81);
  puVar7 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar7 != puVar2) {
    puVar9 = puVar7;
    do {
      puVar10 = (ulong *)(CONCAT71(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                   _1_7_,local_50.super__Bvector_base<std::allocator<bool>_>._M_impl
                                         .super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                         ._M_p._0_1_) + (ulong)(*puVar9 >> 6) * 8);
      *puVar10 = *puVar10 | 1L << ((byte)*puVar9 & 0x3f);
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar2);
    if (puVar7 != puVar2) {
      pvVar3 = (this->_FRsets).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        puVar4 = *(pointer *)
                  ((long)&pvVar3[*puVar7].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (puVar10 = pvVar3[*puVar7].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar10 != puVar4; puVar10 = puVar10 + 1) {
          uVar12 = *puVar10;
          uVar13 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar13 = uVar12;
          }
          local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar13 >> 6) + ((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)]
               = local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar13 >> 6) +
                  ((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                 1L << ((byte)uVar12 & 0x3f);
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar2);
    }
  }
  local_80 = 0.0;
  if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset != 0 ||
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p !=
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p) {
    lVar8 = 0;
    uVar12 = 0;
    puVar10 = local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    do {
      lVar8 = lVar8 + (ulong)((*puVar10 >> (uVar12 & 0x3f) & 1) != 0);
      iVar11 = (int)uVar12;
      puVar10 = puVar10 + (iVar11 == 0x3f);
      uVar12 = (ulong)(iVar11 + 1);
      if (iVar11 == 0x3f) {
        uVar12 = 0;
      }
    } while ((uint)uVar12 !=
             local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset ||
             puVar10 !=
             local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p);
    local_80 = (double)lVar8;
  }
  uVar1 = this->__numV;
  sVar5 = this->__numRRsets;
  pvVar6 = (void *)CONCAT71(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                            local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  auVar14._8_4_ = (int)(sVar5 >> 0x20);
  auVar14._0_8_ = sVar5;
  auVar14._12_4_ = 0x45300000;
  return (local_80 * (double)uVar1) /
         ((auVar14._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
}

Assistant:

double self_inf_cal(const Nodelist& vecSeed)
    {
        std::vector<bool> vecBoolVst = std::vector<bool>(__numRRsets);
        std::vector<bool> vecBoolSeed(__numV);
        for (auto seed : vecSeed) vecBoolSeed[seed] = true;
        for (auto seed : vecSeed)
        {
            for (auto node : _FRsets[seed])
            {
                vecBoolVst[node] = true;
            }
        }
        return 1.0 * std::count(vecBoolVst.begin(), vecBoolVst.end(), true) * __numV / __numRRsets;
    }